

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_provider.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::PixieProvider::HandleAcksAndSendSubscriptionSyncsAndHeartbeats
          (PixieProvider *this,shared_ptr<bidfx_public_api::tools::Client> *client,int thread_num)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  __int_type _Var4;
  element_type *peVar5;
  undefined4 extraout_var;
  pointer this_00;
  element_type *this_01;
  failure *e;
  AckMessage message;
  undefined1 local_30 [8];
  unique_ptr<bidfx_public_api::price::pixie::AckData,_std::default_delete<bidfx_public_api::price::pixie::AckData>_>
  ack_data;
  OutputStream *out;
  shared_ptr<bidfx_public_api::tools::Client> *psStack_18;
  int thread_num_local;
  shared_ptr<bidfx_public_api::tools::Client> *client_local;
  PixieProvider *this_local;
  
  out._4_4_ = thread_num;
  psStack_18 = client;
  client_local = (shared_ptr<bidfx_public_api::tools::Client> *)this;
  peVar5 = std::
           __shared_ptr_access<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)client);
  ack_data._M_t.
  super___uniq_ptr_impl<bidfx_public_api::price::pixie::AckData,_std::default_delete<bidfx_public_api::price::pixie::AckData>_>
  ._M_t.
  super__Tuple_impl<0UL,_bidfx_public_api::price::pixie::AckData_*,_std::default_delete<bidfx_public_api::price::pixie::AckData>_>
  .super__Head_base<0UL,_bidfx_public_api::price::pixie::AckData_*,_false>._M_head_impl._0_4_ =
       (*peVar5->_vptr_Client[4])();
  ack_data._M_t.
  super___uniq_ptr_impl<bidfx_public_api::price::pixie::AckData,_std::default_delete<bidfx_public_api::price::pixie::AckData>_>
  ._M_t.
  super__Tuple_impl<0UL,_bidfx_public_api::price::pixie::AckData_*,_std::default_delete<bidfx_public_api::price::pixie::AckData>_>
  .super__Head_base<0UL,_bidfx_public_api::price::pixie::AckData_*,_false>._M_head_impl._4_4_ =
       extraout_var;
  while( true ) {
    bVar2 = provider::AbstractProvider::IsRunning(&this->super_AbstractProvider);
    iVar1 = out._4_4_;
    bVar3 = false;
    if (bVar2) {
      _Var4 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&this->writer_thread_count_)
      ;
      bVar3 = iVar1 == _Var4;
    }
    if (!bVar3) break;
    PollNextAck((PixieProvider *)local_30);
    bVar3 = std::operator!=((unique_ptr<bidfx_public_api::price::pixie::AckData,_std::default_delete<bidfx_public_api::price::pixie::AckData>_>
                             *)local_30,(nullptr_t)0x0);
    if (bVar3) {
      this_00 = std::
                unique_ptr<bidfx_public_api::price::pixie::AckData,_std::default_delete<bidfx_public_api::price::pixie::AckData>_>
                ::operator->((unique_ptr<bidfx_public_api::price::pixie::AckData,_std::default_delete<bidfx_public_api::price::pixie::AckData>_>
                              *)local_30);
      AckData::ToAckMessage((AckMessage *)&e,this_00);
      WriteMessage(this,(PixieMessage *)&e,
                   (OutputStream *)
                   ack_data._M_t.
                   super___uniq_ptr_impl<bidfx_public_api::price::pixie::AckData,_std::default_delete<bidfx_public_api::price::pixie::AckData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_bidfx_public_api::price::pixie::AckData_*,_std::default_delete<bidfx_public_api::price::pixie::AckData>_>
                   .super__Head_base<0UL,_bidfx_public_api::price::pixie::AckData_*,_false>.
                   _M_head_impl);
    }
    else {
      TryAndWriteHeartbeat
                (this,(OutputStream *)
                      ack_data._M_t.
                      super___uniq_ptr_impl<bidfx_public_api::price::pixie::AckData,_std::default_delete<bidfx_public_api::price::pixie::AckData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_bidfx_public_api::price::pixie::AckData_*,_std::default_delete<bidfx_public_api::price::pixie::AckData>_>
                      .super__Head_base<0UL,_bidfx_public_api::price::pixie::AckData_*,_false>.
                      _M_head_impl);
    }
    PeriodicallyCheckSubscriptions
              (this,(OutputStream *)
                    ack_data._M_t.
                    super___uniq_ptr_impl<bidfx_public_api::price::pixie::AckData,_std::default_delete<bidfx_public_api::price::pixie::AckData>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_bidfx_public_api::price::pixie::AckData_*,_std::default_delete<bidfx_public_api::price::pixie::AckData>_>
                    .super__Head_base<0UL,_bidfx_public_api::price::pixie::AckData_*,_false>.
                    _M_head_impl);
    std::
    unique_ptr<bidfx_public_api::price::pixie::AckData,_std::default_delete<bidfx_public_api::price::pixie::AckData>_>
    ::~unique_ptr((unique_ptr<bidfx_public_api::price::pixie::AckData,_std::default_delete<bidfx_public_api::price::pixie::AckData>_>
                   *)local_30);
  }
  this_01 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)Log);
  spdlog::logger::debug<int>(this_01,"writer {} finished",(int *)((long)&out + 4));
  return;
}

Assistant:

void PixieProvider::HandleAcksAndSendSubscriptionSyncsAndHeartbeats(std::shared_ptr<Client> client, int thread_num)
{
    OutputStream& out = client -> GetOutputStream();
    while (IsRunning() && thread_num == writer_thread_count_)
    {
        try
        {
            std::unique_ptr<AckData> ack_data = PollNextAck();

            if (ack_data != nullptr)
            {
                AckMessage message = ack_data->ToAckMessage();
                WriteMessage(message, out);
            }
            else
            {
                TryAndWriteHeartbeat(out);
            }

            PeriodicallyCheckSubscriptions(out);
        }
        catch (std::ios_base::failure& e)
        {
            Log->warn("writer thread {} encountered a ios error: {}", thread_num, e.what());
            disconnection_triggered_ = true;
            break;
        }
    }

    Log->debug("writer {} finished", thread_num);
}